

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O0

double libcalc::eval(string *expr)

{
  Tokenizer *pTVar1;
  string local_40 [32];
  Tokenizer *local_20;
  Tokenizer *t;
  double result;
  string *expr_local;
  
  t = (Tokenizer *)0x0;
  result = (double)expr;
  pTVar1 = (Tokenizer *)operator_new(0x18);
  std::__cxx11::string::string(local_40,(string *)expr);
  Tokenizer::Tokenizer(pTVar1,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  local_20 = pTVar1;
  t = (Tokenizer *)Tokenizer::evaluate(pTVar1);
  pTVar1 = local_20;
  if (local_20 != (Tokenizer *)0x0) {
    Tokenizer::~Tokenizer(local_20);
    operator_delete(pTVar1);
  }
  return (double)t;
}

Assistant:

double eval(std::string expr) {
  double result = 0;

  Tokenizer *t = new Tokenizer(expr);
  result = t->evaluate();
  delete t;

  return result;
}